

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

void __thiscall cppcms::impl::buddy_allocator::free(buddy_allocator *this,void *__ptr)

{
  buddy_allocator *unaff_retaddr;
  page *p;
  
  if (__ptr != (void *)0x0) {
    free_page(unaff_retaddr,(page *)this);
  }
  return;
}

Assistant:

void free(void *ptr)
	{
		if(!ptr)
			return;
		page *p = reinterpret_cast<page *>(static_cast<char *>(ptr) - alignment);
		assert(p->bits & page_in_use);
		LOG("Freeing page %zx with bits %d",(char *)(p) - memory() , p->bits - page_in_use);
		free_page(p);
	}